

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O0

vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> * __thiscall
hta::Metric::retrieve
          (vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *__return_storage_ptr__,
          Metric *this,TimePoint begin,TimePoint end,IntervalScope scope)

{
  bool bVar1;
  pointer pMVar2;
  Metric *this_local;
  IntervalScope scope_local;
  TimePoint end_local;
  TimePoint begin_local;
  
  scope_local = (IntervalScope)
                end.
                super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                .__d.__r;
  end_local = begin;
  check_read(this);
  bVar1 = std::chrono::operator>
                    (&end_local.
                      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     ,(time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       *)&scope_local);
  if (((bVar1) && (this_local._0_4_ = scope.begin, (Scope)this_local != infinity)) &&
     (this_local._4_4_ = scope.end, this_local._4_4_ != infinity)) {
    throw_exception<hta::Exception,char_const*,hta::Clock::time_point,char_const*,hta::Clock::time_point>
              ("invalid request: begin timestamp ",
               (time_point)
               end_local.
               super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               .__d.__r," larger than end timestamp ",(time_point)scope_local);
  }
  pMVar2 = std::unique_ptr<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>::
           operator->(&this->storage_metric_);
  (*pMVar2->_vptr_Metric[5])
            (__return_storage_ptr__,pMVar2,
             end_local.
             super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
             .__d.__r,scope_local,scope);
  return __return_storage_ptr__;
}

Assistant:

std::vector<TimeValue> Metric::retrieve(TimePoint begin, TimePoint end, IntervalScope scope)
{
    check_read();
    if (begin > end && scope.begin != Scope::infinity && scope.end != Scope::infinity)
    {
        throw_exception("invalid request: begin timestamp ", begin, " larger than end timestamp ",
                        end);
    }
    return storage_metric_->get(begin, end, scope);
}